

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValue
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,int index,
          TextGenerator *generator)

{
  ulong uVar1;
  bool bVar2;
  CppType CVar3;
  Type TVar4;
  ulong uVar5;
  string *psVar6;
  long in_RDI;
  undefined8 in_R9;
  EnumValueDescriptor *enum_desc;
  int enum_value;
  string truncated_value;
  string *value_to_print;
  string *value;
  string scratch;
  FastFieldValuePrinter *printer;
  undefined8 in_stack_fffffffffffffd88;
  int key;
  FieldDescriptor *in_stack_fffffffffffffd90;
  FastFieldValuePrinter *pFVar7;
  undefined4 in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  uint uVar8;
  FieldDescriptor *in_stack_fffffffffffffda0;
  string *format;
  Reflection *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  Reflection *in_stack_fffffffffffffdb8;
  string *local_228;
  bool local_211;
  double local_208;
  float local_1f4;
  uint64 local_1e8;
  uint local_1d4;
  int64 local_1c8;
  uint local_1b4;
  string local_180 [32];
  EnumValueDescriptor *local_160;
  uint local_158;
  TextGenerator *in_stack_fffffffffffffeb0;
  Message *in_stack_fffffffffffffeb8;
  Printer *in_stack_fffffffffffffec0;
  string local_118 [32];
  string local_f8 [32];
  string local_d8;
  string *local_b8;
  string *local_b0;
  string local_a8 [32];
  FastFieldValuePrinter *local_88;
  undefined8 local_30;
  
  key = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  local_30 = in_R9;
  local_88 = GetFieldPrinter((Printer *)
                             CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                             (FieldDescriptor *)in_stack_fffffffffffffda8);
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4490e7);
  pFVar7 = local_88;
  switch(CVar3) {
  case CPPTYPE_INT32:
    bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)0x449131);
    if (bVar2) {
      local_1b4 = Reflection::GetRepeatedInt32
                            (in_stack_fffffffffffffda8,(Message *)in_stack_fffffffffffffda0,
                             (FieldDescriptor *)
                             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                             (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
    }
    else {
      local_1b4 = Reflection::GetInt32
                            (in_stack_fffffffffffffda8,(Message *)in_stack_fffffffffffffda0,
                             (FieldDescriptor *)
                             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    }
    (*pFVar7->_vptr_FastFieldValuePrinter[3])(pFVar7,(ulong)local_1b4,local_30);
    break;
  case CPPTYPE_INT64:
    bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4491c7);
    if (bVar2) {
      local_1c8 = Reflection::GetRepeatedInt64
                            (in_stack_fffffffffffffda8,(Message *)in_stack_fffffffffffffda0,
                             (FieldDescriptor *)
                             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                             (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
    }
    else {
      local_1c8 = Reflection::GetInt64
                            (in_stack_fffffffffffffda8,(Message *)in_stack_fffffffffffffda0,
                             (FieldDescriptor *)
                             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    }
    (*pFVar7->_vptr_FastFieldValuePrinter[5])(pFVar7,local_1c8,local_30);
    break;
  case CPPTYPE_UINT32:
    bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)0x449260);
    if (bVar2) {
      local_1d4 = Reflection::GetRepeatedUInt32
                            (in_stack_fffffffffffffda8,(Message *)in_stack_fffffffffffffda0,
                             (FieldDescriptor *)
                             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                             (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
    }
    else {
      local_1d4 = Reflection::GetUInt32
                            (in_stack_fffffffffffffda8,(Message *)in_stack_fffffffffffffda0,
                             (FieldDescriptor *)
                             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    }
    (*pFVar7->_vptr_FastFieldValuePrinter[4])(pFVar7,(ulong)local_1d4,local_30);
    break;
  case CPPTYPE_UINT64:
    bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4492f6);
    if (bVar2) {
      local_1e8 = Reflection::GetRepeatedUInt64
                            (in_stack_fffffffffffffda8,(Message *)in_stack_fffffffffffffda0,
                             (FieldDescriptor *)
                             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                             (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
    }
    else {
      local_1e8 = Reflection::GetUInt64
                            (in_stack_fffffffffffffda8,(Message *)in_stack_fffffffffffffda0,
                             (FieldDescriptor *)
                             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    }
    (*pFVar7->_vptr_FastFieldValuePrinter[6])(pFVar7,local_1e8,local_30);
    break;
  case CPPTYPE_DOUBLE:
    bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)0x449428);
    if (bVar2) {
      local_208 = Reflection::GetRepeatedDouble
                            (in_stack_fffffffffffffda8,(Message *)in_stack_fffffffffffffda0,
                             (FieldDescriptor *)
                             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                             (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
    }
    else {
      local_208 = Reflection::GetDouble
                            (in_stack_fffffffffffffda8,(Message *)in_stack_fffffffffffffda0,
                             (FieldDescriptor *)
                             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    }
    (*pFVar7->_vptr_FastFieldValuePrinter[8])(local_208,pFVar7,local_30);
    break;
  case CPPTYPE_FLOAT:
    bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)0x44938f);
    if (bVar2) {
      local_1f4 = Reflection::GetRepeatedFloat
                            (in_stack_fffffffffffffda8,(Message *)in_stack_fffffffffffffda0,
                             (FieldDescriptor *)
                             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                             (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
    }
    else {
      local_1f4 = Reflection::GetFloat
                            (in_stack_fffffffffffffda8,(Message *)in_stack_fffffffffffffda0,
                             (FieldDescriptor *)
                             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    }
    (*pFVar7->_vptr_FastFieldValuePrinter[7])((ulong)(uint)local_1f4,pFVar7,local_30);
    break;
  case CPPTYPE_BOOL:
    bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4494b5);
    if (bVar2) {
      local_211 = Reflection::GetRepeatedBool
                            (in_stack_fffffffffffffda8,(Message *)in_stack_fffffffffffffda0,
                             (FieldDescriptor *)
                             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                             (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
    }
    else {
      local_211 = Reflection::GetBool(in_stack_fffffffffffffda8,(Message *)in_stack_fffffffffffffda0
                                      ,(FieldDescriptor *)
                                       CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98)
                                     );
    }
    (*pFVar7->_vptr_FastFieldValuePrinter[2])(pFVar7,(ulong)local_211,local_30);
    break;
  case CPPTYPE_ENUM:
    bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4498a3);
    if (bVar2) {
      local_158 = Reflection::GetRepeatedEnumValue
                            ((Reflection *)
                             CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                             (Message *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                             in_stack_fffffffffffffd9c);
    }
    else {
      local_158 = Reflection::GetEnumValue
                            ((Reflection *)
                             CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                             (Message *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
    }
    FieldDescriptor::enum_type(in_stack_fffffffffffffd90);
    local_160 = EnumDescriptor::FindValueByNumber((EnumDescriptor *)in_stack_fffffffffffffd90,key);
    if (local_160 == (EnumValueDescriptor *)0x0) {
      format = local_180;
      pFVar7 = local_88;
      uVar8 = local_158;
      StringPrintf_abi_cxx11_((char *)format,"%d");
      (*pFVar7->_vptr_FastFieldValuePrinter[0xb])(pFVar7,(ulong)uVar8,format,local_30);
      std::__cxx11::string::~string(local_180);
    }
    else {
      pFVar7 = local_88;
      uVar8 = local_158;
      psVar6 = EnumValueDescriptor::name_abi_cxx11_(local_160);
      (*pFVar7->_vptr_FastFieldValuePrinter[0xb])(pFVar7,(ulong)uVar8,psVar6,local_30);
    }
    break;
  case CPPTYPE_STRING:
    std::__cxx11::string::string(local_a8);
    bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)0x449545);
    if (bVar2) {
      local_228 = Reflection::GetRepeatedStringReference
                            (in_stack_fffffffffffffdb8,
                             (Message *)
                             CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                             (FieldDescriptor *)in_stack_fffffffffffffda8,
                             (int)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                             (string *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98)
                            );
    }
    else {
      local_228 = Reflection::GetStringReference
                            ((Reflection *)
                             CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                             (Message *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                             (string *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98)
                            );
    }
    local_b0 = local_228;
    local_b8 = local_228;
    std::__cxx11::string::string((string *)&local_d8);
    if ((0 < *(long *)(in_RDI + 0x10)) &&
       (uVar1 = *(ulong *)(in_RDI + 0x10), uVar5 = std::__cxx11::string::size(), uVar1 < uVar5)) {
      std::__cxx11::string::substr((ulong)local_118,(ulong)local_b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                     (char *)in_stack_fffffffffffffd90);
      std::__cxx11::string::operator=((string *)&local_d8,local_f8);
      std::__cxx11::string::~string(local_f8);
      std::__cxx11::string::~string(local_118);
      local_b8 = &local_d8;
    }
    TVar4 = FieldDescriptor::type(in_stack_fffffffffffffda0);
    if (TVar4 == TYPE_STRING) {
      (*local_88->_vptr_FastFieldValuePrinter[9])(local_88,local_b8,local_30);
    }
    else {
      (*local_88->_vptr_FastFieldValuePrinter[10])(local_88,local_b8,local_30);
    }
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string(local_a8);
    break;
  case CPPTYPE_MESSAGE:
    bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)0x449a0a);
    if (bVar2) {
      Reflection::GetRepeatedMessage
                (in_stack_fffffffffffffda8,(Message *)in_stack_fffffffffffffda0,
                 (FieldDescriptor *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                 (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
    }
    else {
      Reflection::GetMessage
                (in_stack_fffffffffffffdb8,
                 (Message *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 (FieldDescriptor *)in_stack_fffffffffffffda8,
                 (MessageFactory *)in_stack_fffffffffffffda0);
    }
    Print(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldValue(const Message& message,
                                          const Reflection* reflection,
                                          const FieldDescriptor* field,
                                          int index,
                                          TextGenerator* generator) const {
  GOOGLE_DCHECK(field->is_repeated() || (index == -1))
      << "Index must be -1 for non-repeated fields";

  const FastFieldValuePrinter* printer = GetFieldPrinter(field);

  switch (field->cpp_type()) {
#define OUTPUT_FIELD(CPPTYPE, METHOD)                                \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                           \
    printer->Print##METHOD(                                          \
        field->is_repeated()                                         \
            ? reflection->GetRepeated##METHOD(message, field, index) \
            : reflection->Get##METHOD(message, field),               \
        generator);                                                  \
    break

    OUTPUT_FIELD(INT32, Int32);
    OUTPUT_FIELD(INT64, Int64);
    OUTPUT_FIELD(UINT32, UInt32);
    OUTPUT_FIELD(UINT64, UInt64);
    OUTPUT_FIELD(FLOAT, Float);
    OUTPUT_FIELD(DOUBLE, Double);
    OUTPUT_FIELD(BOOL, Bool);
#undef OUTPUT_FIELD

    case FieldDescriptor::CPPTYPE_STRING: {
      std::string scratch;
      const std::string& value =
          field->is_repeated()
              ? reflection->GetRepeatedStringReference(message, field, index,
                                                       &scratch)
              : reflection->GetStringReference(message, field, &scratch);
      const std::string* value_to_print = &value;
      std::string truncated_value;
      if (truncate_string_field_longer_than_ > 0 &&
          truncate_string_field_longer_than_ < value.size()) {
        truncated_value = value.substr(0, truncate_string_field_longer_than_) +
                          "...<truncated>...";
        value_to_print = &truncated_value;
      }
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        printer->PrintString(*value_to_print, generator);
      } else {
        GOOGLE_DCHECK_EQ(field->type(), FieldDescriptor::TYPE_BYTES);
        printer->PrintBytes(*value_to_print, generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_ENUM: {
      int enum_value =
          field->is_repeated()
              ? reflection->GetRepeatedEnumValue(message, field, index)
              : reflection->GetEnumValue(message, field);
      const EnumValueDescriptor* enum_desc =
          field->enum_type()->FindValueByNumber(enum_value);
      if (enum_desc != nullptr) {
        printer->PrintEnum(enum_value, enum_desc->name(), generator);
      } else {
        // Ordinarily, enum_desc should not be null, because proto2 has the
        // invariant that set enum field values must be in-range, but with the
        // new integer-based API for enums (or the RepeatedField<int> loophole),
        // it is possible for the user to force an unknown integer value.  So we
        // simply use the integer value itself as the enum value name in this
        // case.
        printer->PrintEnum(enum_value, StringPrintf("%d", enum_value),
                           generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_MESSAGE:
      Print(field->is_repeated()
                ? reflection->GetRepeatedMessage(message, field, index)
                : reflection->GetMessage(message, field),
            generator);
      break;
  }
}